

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O0

bool __thiscall PacketProcessor::findHeader(PacketProcessor *this)

{
  size_type sVar1;
  reference pvVar2;
  ulong uVar3;
  const_iterator __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  uchar *local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  ulong local_20;
  type_conflict i;
  PacketProcessor *this_local;
  
  if ((this->findHeader_ & 1U) == 0) {
    i = (type_conflict)this;
    for (local_20 = 0; uVar3 = local_20,
        sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_),
        uVar3 < sVar1; local_20 = local_20 + 1) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->buffer_,local_20);
      if (*pvVar2 == 'Z') {
        uVar3 = local_20 + 1;
        sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
        if (sVar1 <= uVar3) {
          local_48._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                  (&this->buffer_);
          local_40 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator-(&local_48,1);
          __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend(&this->buffer_);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,local_40,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__last._M_current);
          return false;
        }
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->buffer_,local_20 + 1);
        if (*pvVar2 == 0xa5) {
          if (local_20 != 0) {
            local_30._M_current =
                 (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                                    (&this->buffer_);
            local_28 = __gnu_cxx::
                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator+(&local_30,local_20);
            local_38 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                          (&this->buffer_);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,
                       local_28,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 )local_38);
          }
          this->findHeader_ = true;
          return true;
        }
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PacketProcessor::findHeader() {
  if (findHeader_) return true;

  FOR(i, buffer_.size()) {
    if (buffer_[i] == H_1) {
      if (i + 1 < buffer_.size()) {
        if (buffer_[i + 1] == H_2) {
          if (i != 0) {
            buffer_.assign(buffer_.cbegin() + i, buffer_.cend());
          }
          findHeader_ = true;
          return true;
        }
      } else {
        buffer_.assign(buffer_.cend() - 1, buffer_.cend());
        return false;
      }
    }
  }

  return false;
}